

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::ConsumeBranchIsland(IRBuilder *this)

{
  ByteCodeReader *this_00;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint offset;
  undefined8 in_RAX;
  undefined4 *puVar4;
  undefined8 uStack_38;
  LayoutSize layoutSize;
  
  this_00 = &this->m_jnReader;
  uStack_38 = in_RAX;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    offset = Js::ByteCodeReader::GetCurrentOffset(this_00);
    OVar3 = Js::ByteCodeReader::ReadOp(this_00,(LayoutSize *)((long)&uStack_38 + 4));
    if (OVar3 != BrLong) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c4b,"(opcode == Js::OpCode::BrLong)","opcode == Js::OpCode::BrLong");
      if (!bVar2) goto LAB_00499e7d;
      *puVar4 = 0;
    }
    if (uStack_38._4_4_ != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1c4c,"(layoutSize == Js::SmallLayout)","layoutSize == Js::SmallLayout");
      if (!bVar2) {
LAB_00499e7d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    BuildBrLong(this,BrLong,offset);
    OVar3 = Js::ByteCodeReader::PeekOp(this_00);
    if (OVar3 != BrLong) {
      return;
    }
  } while( true );
}

Assistant:

void
IRBuilder::ConsumeBranchIsland()
{
    do
    {
        uint32 offset = m_jnReader.GetCurrentOffset();
        Js::LayoutSize layoutSize;
        Js::OpCode opcode = m_jnReader.ReadOp(layoutSize);
        Assert(opcode == Js::OpCode::BrLong);
        Assert(layoutSize == Js::SmallLayout);
        BuildBrLong(Js::OpCode::BrLong, offset);
    }
    while (m_jnReader.PeekOp() == Js::OpCode::BrLong);
}